

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_4cac::Test_TemplateDictionary_ShowSection::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  bool bVar13;
  int iVar14;
  char *pcVar15;
  TemplateDictionaryPeer subdict_peer;
  string dump;
  TemplateDictionary dict;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_c8;
  TemplateString local_a8;
  TemplateString local_88;
  TemplateString local_68;
  TemplateString local_48;
  TemplateString local_28;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"test_SetShowSection");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&dump,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_48,"bigmamainclude!.tpl");
  TVar1.length_ = local_48.length_;
  TVar1.ptr_ = local_48.ptr_;
  TVar1.is_immutable_ = local_48.is_immutable_;
  TVar1._17_7_ = local_48._17_7_;
  TVar1.id_ = local_48.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar1);
  ctemplate::TemplateString::TemplateString(&local_68,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_88,"foo");
  TVar2.length_ = local_68.length_;
  TVar2.ptr_ = local_68.ptr_;
  TVar2.is_immutable_ = local_68.is_immutable_;
  TVar2._17_7_ = local_68._17_7_;
  TVar2.id_ = local_68.id_;
  TVar10.length_ = local_88.length_;
  TVar10.ptr_ = local_88.ptr_;
  TVar10.is_immutable_ = local_88.is_immutable_;
  TVar10._17_7_ = local_88._17_7_;
  TVar10.id_ = local_88.id_;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar10);
  ctemplate::TemplateString::TemplateString(&local_a8,"TOPLEVEL2");
  ctemplate::TemplateString::TemplateString(&local_c8,"foo2");
  TVar3.length_ = local_a8.length_;
  TVar3.ptr_ = local_a8.ptr_;
  TVar3.is_immutable_ = local_a8.is_immutable_;
  TVar3._17_7_ = local_a8._17_7_;
  TVar3.id_ = local_a8.id_;
  TVar11.length_ = local_c8.length_;
  TVar11.ptr_ = local_c8.ptr_;
  TVar11.is_immutable_ = local_c8.is_immutable_;
  TVar11._17_7_ = local_c8._17_7_;
  TVar11.id_ = local_c8.id_;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar11);
  ctemplate::TemplateString::TemplateString(&local_e8,"section1");
  TVar4.length_ = local_e8.length_;
  TVar4.ptr_ = local_e8.ptr_;
  TVar4.is_immutable_ = local_e8.is_immutable_;
  TVar4._17_7_ = local_e8._17_7_;
  TVar4.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar4);
  ctemplate::TemplateString::TemplateString(&local_108,"section2");
  TVar5.length_ = local_108.length_;
  TVar5.ptr_ = local_108.ptr_;
  TVar5.is_immutable_ = local_108.is_immutable_;
  TVar5._17_7_ = local_108._17_7_;
  TVar5.id_ = local_108.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar5);
  ctemplate::TemplateString::TemplateString(&local_128,"section2");
  TVar6.length_ = local_128.length_;
  TVar6.ptr_ = local_128.ptr_;
  TVar6.is_immutable_ = local_128.is_immutable_;
  TVar6._17_7_ = local_128._17_7_;
  TVar6.id_ = local_128.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar6);
  ctemplate::TemplateString::TemplateString(&local_148,"section3");
  TVar7.length_ = local_148.length_;
  TVar7.ptr_ = local_148.ptr_;
  TVar7.is_immutable_ = local_148.is_immutable_;
  TVar7._17_7_ = local_148._17_7_;
  TVar7.id_ = local_148.id_;
  subdict_peer.dict_ =
       (TemplateDictionary *)ctemplate::TemplateDictionary::AddSectionDictionary(TVar7);
  ctemplate::TemplateString::TemplateString(&local_168,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_188,"bar");
  TVar8.length_ = local_168.length_;
  TVar8.ptr_ = local_168.ptr_;
  TVar8.is_immutable_ = local_168.is_immutable_;
  TVar8._17_7_ = local_168._17_7_;
  TVar8.id_ = local_168.id_;
  TVar12.length_ = local_188.length_;
  TVar12.ptr_ = local_188.ptr_;
  TVar12.is_immutable_ = local_188.is_immutable_;
  TVar12._17_7_ = local_188._17_7_;
  TVar12.id_ = local_188.id_;
  ctemplate::TemplateDictionary::SetValue(TVar8,TVar12);
  ctemplate::TemplateString::TemplateString(&local_1a8,"section3");
  TVar9.length_ = local_1a8.length_;
  TVar9.ptr_ = local_1a8.ptr_;
  TVar9.is_immutable_ = local_1a8.is_immutable_;
  TVar9._17_7_ = local_1a8._17_7_;
  TVar9.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar9);
  ctemplate::TemplateString::TemplateString((TemplateString *)&dump,"TOPLEVEL");
  ctemplate::TemplateString::TemplateString(&local_28,"bar");
  bVar13 = ctemplate::TemplateDictionaryPeer::ValueIs
                     (&subdict_peer,(TemplateString *)&dump,&local_28);
  if (bVar13) {
    dump._M_dataplus._M_p = (pointer)&dump.field_2;
    dump._M_string_length = 0;
    dump.field_2._M_local_buf[0] = '\0';
    ctemplate::TemplateDictionary::DumpToString((string *)&dict,(int)&dump);
    iVar14 = strcmp(dump._M_dataplus._M_p,
                    "global dictionary {\n   BI_NEWLINE: >\n<\n   BI_SPACE: > <\n   GLOBAL: >top<\n};\ndictionary \'test_SetShowSection (intended for bigmamainclude!.tpl)\' {\n   TOPLEVEL: >foo<\n   TOPLEVEL2: >foo2<\n   section section1 (dict 1 of 1) -->\n     dictionary \'empty dictionary\' {\n     }\n   section section2 (dict 1 of 1) -->\n     dictionary \'empty dictionary\' {\n     }\n   section section3 (dict 1 of 1) -->\n     dictionary \'test_SetShowSection/section3#1\' {\n       TOPLEVEL: >bar<\n     }\n}\n"
                   );
    if (iVar14 == 0) {
      std::__cxx11::string::~string((string *)&dump);
      ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
      return;
    }
    pcVar15 = "strcmp(dump.c_str(), expected) == 0";
  }
  else {
    pcVar15 = "subdict_peer.ValueIs(\"TOPLEVEL\", \"bar\")";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar15);
  exit(1);
}

Assistant:

TEST(TemplateDictionary, ShowSection) {
  TemplateDictionary dict("test_SetShowSection", NULL);
  // Let's say what filename dict is associated with
  dict.SetFilename("bigmamainclude!.tpl");
  dict.SetValue("TOPLEVEL", "foo");
  dict.SetValue("TOPLEVEL2", "foo2");
  dict.ShowSection("section1");
  dict.ShowSection("section2");
  // Test calling ShowSection twice on the same section
  dict.ShowSection("section2");
  // Test that ShowSection is a no-op if called after AddSectionDictionary()
  TemplateDictionary* subdict = dict.AddSectionDictionary("section3");
  TemplateDictionaryPeer subdict_peer(subdict);
  subdict->SetValue("TOPLEVEL", "bar");
  dict.ShowSection("section3");

  EXPECT_TRUE(subdict_peer.ValueIs("TOPLEVEL", "bar"));

  // Since ShowSection() doesn't return a sub-dict, the only way to
  // probe what the dicts look like is via Dump()
  string dump;
  dict.DumpToString(&dump);
  const char* const expected =
    ("global dictionary {\n"
     "   BI_NEWLINE: >\n"
     "<\n"
     "   BI_SPACE: > <\n"
     "   GLOBAL: >top<\n"
     "};\n"
     "dictionary 'test_SetShowSection (intended for bigmamainclude!.tpl)' {\n"
     "   TOPLEVEL: >foo<\n"
     "   TOPLEVEL2: >foo2<\n"
     "   section section1 (dict 1 of 1) -->\n"
     "     dictionary 'empty dictionary' {\n"
     "     }\n"
     "   section section2 (dict 1 of 1) -->\n"
     "     dictionary 'empty dictionary' {\n"
     "     }\n"
     "   section section3 (dict 1 of 1) -->\n"
     "     dictionary 'test_SetShowSection/section3#1' {\n"
     "       TOPLEVEL: >bar<\n"
     "     }\n"
     "}\n");
  EXPECT_STREQ(dump.c_str(), expected);
}